

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_miniz.h
# Opt level: O1

void * buminiz::tdefl_write_image_to_png_file_in_memory_ex
                 (void *pImage,int w,int h,int num_chans,size_t *pLen_out,mz_uint level,mz_bool flip
                 )

{
  int6 iVar1;
  size_t *psVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  tdefl_status tVar6;
  mz_bool mVar7;
  tdefl_compressor *d;
  ulong uVar8;
  size_t sVar9;
  mz_ulong mVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  tdefl_output_buffer out_buf;
  int local_ac;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined2 local_98;
  undefined1 uStack_96;
  undefined1 uStack_95;
  undefined2 uStack_94;
  undefined1 uStack_92;
  undefined1 uStack_91;
  undefined1 uStack_90;
  uint uStack_8f;
  byte bStack_8b;
  undefined2 uStack_8a;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined1 uStack_86;
  undefined1 uStack_85;
  undefined1 uStack_84;
  undefined4 uStack_83;
  ulong local_78;
  int local_70;
  int local_6c;
  long local_68;
  ulong uStack_60;
  tdefl_compressor *local_58;
  undefined8 uStack_50;
  size_t *local_40;
  void *local_38;
  
  local_38 = pImage;
  d = (tdefl_compressor *)malloc(0x4df78);
  *pLen_out = 0;
  if (d != (tdefl_compressor *)0x0) {
    iVar12 = num_chans * w;
    local_58 = (tdefl_compressor *)0x0;
    local_68 = 0;
    uStack_50 = 1;
    iVar4 = (iVar12 + 1) * h;
    iVar13 = 0x40;
    if (0x40 < iVar4) {
      iVar13 = iVar4;
    }
    uStack_60 = (ulong)(iVar13 + 0x39);
    local_78 = (ulong)(uint)h;
    local_6c = w;
    local_58 = (tdefl_compressor *)malloc(uStack_60);
    if (local_58 != (tdefl_compressor *)0x0) {
      local_ac = 0x29;
      local_70 = num_chans;
      local_40 = pLen_out;
      do {
        tdefl_output_buffer_putter(&local_ac,1,&local_68);
        local_ac = local_ac + -1;
      } while (local_ac != 0);
      uVar8 = 10;
      if (level < 10) {
        uVar8 = (ulong)level;
      }
      tdefl_init(d,tdefl_output_buffer_putter,&local_68,
                 (uint)(level < 4) << 0xe |
                 tdefl_write_image_to_png_file_in_memory_ex::s_tdefl_png_num_probes[uVar8] | 0x1000)
      ;
      pvVar3 = local_38;
      if (0 < (int)local_78) {
        iVar4 = 0;
        iVar13 = (int)local_78;
        do {
          iVar13 = iVar13 + -1;
          tdefl_compress_buffer(d,&local_ac,1,TDEFL_NO_FLUSH);
          iVar5 = iVar13;
          if (flip == 0) {
            iVar5 = iVar4;
          }
          tdefl_compress_buffer
                    (d,(void *)((long)(iVar5 * iVar12) + (long)pvVar3),(long)iVar12,TDEFL_NO_FLUSH);
          iVar4 = iVar4 + 1;
        } while (iVar13 != 0);
      }
      tVar6 = tdefl_compress_buffer(d,(void *)0x0,0,TDEFL_FINISH);
      psVar2 = local_40;
      if (tVar6 == TDEFL_STATUS_DONE) {
        sVar9 = local_68 - 0x29;
        *local_40 = sVar9;
        local_a8 = 0xa1a0a0d474e5089;
        uStack_a0 = 0x524448490d000000;
        local_98 = 0;
        uStack_96 = (undefined1)((uint)local_6c >> 8);
        uStack_95 = (char)local_6c;
        uStack_94 = 0;
        uStack_92 = (undefined1)(local_78 >> 8);
        uStack_91 = (char)local_78;
        uStack_90 = 8;
        uStack_8f = (uint)""[local_70];
        bStack_8b = 0;
        uStack_8a = 0;
        uStack_88 = 0;
        uStack_87 = (undefined1)(sVar9 >> 0x18);
        uStack_86 = (undefined1)(sVar9 >> 0x10);
        uStack_85 = (undefined1)(sVar9 >> 8);
        uStack_84 = (undefined1)sVar9;
        uStack_83 = 0x54414449;
        uVar14 = 0xffffffff;
        lVar11 = -0x11;
        do {
          uVar14 = uVar14 >> 4 ^ mz_crc32::s_crc32[(uVar14 ^ (&bStack_8b)[lVar11]) & 0xf];
          uVar14 = uVar14 >> 4 ^ mz_crc32::s_crc32[(uint)((&bStack_8b)[lVar11] >> 4) ^ uVar14 & 0xf]
          ;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0);
        uVar14 = ~uVar14;
        lVar11 = 0x1d;
        do {
          *(char *)((long)&local_a8 + lVar11) = (char)(uVar14 >> 0x18);
          uVar14 = uVar14 << 8;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x21);
        *(ulong *)((long)local_58->m_max_probes + 5) =
             CONCAT17(uStack_88,CONCAT25(uStack_8a,CONCAT14(bStack_8b,uStack_8f)));
        *(ulong *)((long)&local_58->m_adler32 + 1) =
             CONCAT44(0x54414449,
                      CONCAT13(uStack_84,CONCAT12(uStack_85,CONCAT11(uStack_86,uStack_87))));
        iVar1 = (uint6)CONCAT11((char)local_6c,uStack_96) << 0x10;
        local_58->m_flags = (int)iVar1;
        local_58->m_max_probes[0] =
             (int)(CONCAT17((char)local_78,CONCAT16(uStack_92,iVar1)) >> 0x20);
        *(ulong *)(local_58->m_max_probes + 1) =
             CONCAT26(uStack_8a,CONCAT15(bStack_8b,CONCAT41(uStack_8f,8)));
        local_58->m_pPut_buf_func = (tdefl_put_buf_func_ptr)0xa1a0a0d474e5089;
        local_58->m_pPut_buf_user = (void *)0x524448490d000000;
        mVar7 = tdefl_output_buffer_putter("",0x10,&local_68);
        if (mVar7 != 0) {
          lVar11 = 0;
          mVar10 = mz_crc32(0,(mz_uint8 *)((long)&local_58->m_lookahead_pos + 1),*psVar2 + 4);
          do {
            *(char *)((long)local_58->m_max_probes + lVar11 + local_68 + -0x24) =
                 (char)(mVar10 >> 0x18);
            lVar11 = lVar11 + 1;
            mVar10 = (mz_ulong)(uint)((int)mVar10 << 8);
          } while (lVar11 != 4);
          *psVar2 = *psVar2 + 0x39;
          free(d);
          return local_58;
        }
        *psVar2 = 0;
      }
      free(d);
      d = local_58;
    }
    free(d);
  }
  return (void *)0x0;
}

Assistant:

void *tdefl_write_image_to_png_file_in_memory_ex(const void *pImage, int w, int h, int num_chans, size_t *pLen_out, mz_uint level, mz_bool flip)
{
  // Using a local copy of this array here in case MINIZ_NO_ZLIB_APIS was defined.
  static const mz_uint s_tdefl_png_num_probes[11] = { 0, 1, 6, 32,  16, 32, 128, 256,  512, 768, 1500 };
  tdefl_compressor *pComp = (tdefl_compressor *)MZ_MALLOC(sizeof(tdefl_compressor)); tdefl_output_buffer out_buf; int i, bpl = w * num_chans, y, z; mz_uint32 c; *pLen_out = 0;
  if (!pComp) return NULL;
  MZ_CLEAR_OBJ(out_buf); out_buf.m_expandable = MZ_TRUE; out_buf.m_capacity = 57+MZ_MAX(64, (1+bpl)*h); if (NULL == (out_buf.m_pBuf = (mz_uint8*)MZ_MALLOC(out_buf.m_capacity))) { MZ_FREE(pComp); return NULL; }
  // write dummy header
  for (z = 41; z; --z) tdefl_output_buffer_putter(&z, 1, &out_buf);
  // compress image data
  tdefl_init(pComp, tdefl_output_buffer_putter, &out_buf, s_tdefl_png_num_probes[MZ_MIN(10, level)] | TDEFL_WRITE_ZLIB_HEADER | (level <= 3 ? TDEFL_GREEDY_PARSING_FLAG : 0));
  for (y = 0; y < h; ++y) { tdefl_compress_buffer(pComp, &z, 1, TDEFL_NO_FLUSH); tdefl_compress_buffer(pComp, (mz_uint8*)pImage + (flip ? (h - 1 - y) : y) * bpl, bpl, TDEFL_NO_FLUSH); }
  if (tdefl_compress_buffer(pComp, NULL, 0, TDEFL_FINISH) != TDEFL_STATUS_DONE) { MZ_FREE(pComp); MZ_FREE(out_buf.m_pBuf); return NULL; }
  // write real header
  *pLen_out = out_buf.m_size-41;
  {
    static const mz_uint8 chans[] = {0x00, 0x00, 0x04, 0x02, 0x06};
    mz_uint8 pnghdr[41]={0x89,0x50,0x4e,0x47,0x0d,0x0a,0x1a,0x0a,0x00,0x00,0x00,0x0d,0x49,0x48,0x44,0x52,
      0,0,(mz_uint8)(w>>8),(mz_uint8)w,0,0,(mz_uint8)(h>>8),(mz_uint8)h,8,chans[num_chans],0,0,0,0,0,0,0,
      (mz_uint8)(*pLen_out>>24),(mz_uint8)(*pLen_out>>16),(mz_uint8)(*pLen_out>>8),(mz_uint8)*pLen_out,0x49,0x44,0x41,0x54};
    c=(mz_uint32)mz_crc32(MZ_CRC32_INIT,pnghdr+12,17); for (i=0; i<4; ++i, c<<=8) ((mz_uint8*)(pnghdr+29))[i]=(mz_uint8)(c>>24);
    memcpy(out_buf.m_pBuf, pnghdr, 41);
  }
  // write footer (IDAT CRC-32, followed by IEND chunk)
  if (!tdefl_output_buffer_putter("\0\0\0\0\0\0\0\0\x49\x45\x4e\x44\xae\x42\x60\x82", 16, &out_buf)) { *pLen_out = 0; MZ_FREE(pComp); MZ_FREE(out_buf.m_pBuf); return NULL; }
  c = (mz_uint32)mz_crc32(MZ_CRC32_INIT,out_buf.m_pBuf+41-4, *pLen_out+4); for (i=0; i<4; ++i, c<<=8) (out_buf.m_pBuf+out_buf.m_size-16)[i] = (mz_uint8)(c >> 24);
  // compute final size of file, grab compressed data buffer and return
  *pLen_out += 57; MZ_FREE(pComp); return out_buf.m_pBuf;
}